

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

void uv__fs_work(uv__work *w)

{
  _func_void_uv__work_ptr_int **buf;
  int iVar1;
  _func_void_uv__work_ptr_int *len;
  iovec *__iovec;
  uv__work *puVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  uv_dirent_type_t uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint *puVar11;
  ssize_t sVar12;
  ulong uVar13;
  size_t sVar14;
  dirent64 *dent;
  uv__queue *puVar15;
  uv__queue *puVar16;
  uv__queue *puVar17;
  char *pcVar18;
  size_t sVar19;
  ssize_t sVar20;
  long lVar21;
  _func_void_uv__work_ptr *p_Var22;
  uv__work *__iovec_00;
  uv__queue **ppuVar23;
  uv__queue *puVar24;
  uint uVar25;
  long lVar26;
  size_t len_00;
  uv__queue *puStackY_21b0;
  uint local_2194;
  _func_void_uv__work_ptr *local_2180;
  stat64 local_2158;
  pollfd pfd;
  __ino64_t local_20c0;
  __mode_t local_20b0;
  size_t local_2098;
  statfs s;
  
  iVar1 = *(int *)&w[-7].done;
  puVar11 = (uint *)__errno_location();
  buf = &w[-6].done;
  do {
    *puVar11 = 0;
    switch(*(undefined4 *)&w[-7].done) {
    case 1:
      iVar6 = open64((char *)w[-6].work,*(uint *)((long)&w[-2].loop + 4) | 0x80000,
                     (ulong)*(uint *)&w[-2].wq.next);
      break;
    case 2:
      iVar6 = uv__close_nocancel(*(int *)&w[-2].loop);
      if (iVar6 == -1) {
        iVar6 = -(uint)(*puVar11 != 0x73 && *puVar11 != 4);
      }
      break;
    case 3:
      iVar6 = *(int *)&w[-2].loop;
      uVar8 = *(uint *)((long)&w[-2].wq.next + 4);
      p_Var22 = w[-1].work;
      __iovec = (iovec *)w[-2].wq.prev;
      uVar9 = uv__getiovmax();
      if (uVar8 < uVar9) {
        uVar9 = uVar8;
      }
      puStackY_21b0 = (uv__queue *)(ulong)uVar9;
      if ((long)p_Var22 < 0) {
        if (uVar9 != 0) {
          if (uVar9 == 1) {
            puStackY_21b0 = (uv__queue *)read(iVar6,__iovec->iov_base,__iovec->iov_len);
          }
          else {
            puStackY_21b0 = (uv__queue *)readv(iVar6,__iovec,uVar9);
          }
        }
      }
      else if (uVar9 != 0) {
        if (uVar9 == 1) {
          puStackY_21b0 =
               (uv__queue *)pread64(iVar6,__iovec->iov_base,__iovec->iov_len,(__off64_t)p_Var22);
        }
        else {
          puStackY_21b0 = (uv__queue *)preadv64(iVar6,__iovec,uVar9,(__off64_t)p_Var22);
        }
      }
      if ((w[-7].loop != (uv_loop_s *)0x0) && (puVar2 = (uv__work *)w[-2].wq.prev, puVar2 != w + 1))
      {
        uv__free(puVar2);
      }
      w[-2].wq.prev = (uv__queue *)0x0;
      *(undefined4 *)((long)&w[-2].wq.next + 4) = 0;
      goto LAB_0011062e;
    case 4:
      uVar9 = uv__getiovmax();
      puVar2 = (uv__work *)w[-2].wq.prev;
      puStackY_21b0 = (uv__queue *)0x0;
      __iovec_00 = puVar2;
      for (uVar8 = *(uint *)((long)&w[-2].wq.next + 4); uVar8 != 0; uVar8 = uVar8 - uVar25) {
        uVar25 = uVar9;
        if (uVar8 < uVar9) {
          uVar25 = uVar8;
        }
        *(uint *)((long)&w[-2].wq.next + 4) = uVar25;
        while( true ) {
          puVar16 = (uv__queue *)(ulong)uVar25;
          iVar6 = *(int *)&w[-2].loop;
          p_Var22 = w[-1].work;
          if ((long)p_Var22 < 0) {
            if (uVar25 == 1) {
              puVar16 = (uv__queue *)write(iVar6,__iovec_00->work,(size_t)__iovec_00->done);
            }
            else {
              if (uVar25 == 0) goto LAB_00110b48;
              puVar16 = (uv__queue *)writev(iVar6,(iovec *)__iovec_00,uVar25);
            }
          }
          else if (uVar25 == 1) {
            puVar16 = (uv__queue *)
                      pwrite64(iVar6,__iovec_00->work,(size_t)__iovec_00->done,(__off64_t)p_Var22);
          }
          else {
            if (uVar25 == 0) goto LAB_00110b48;
            puVar16 = (uv__queue *)pwritev64(iVar6,(iovec *)__iovec_00,uVar25,(__off64_t)p_Var22);
          }
          if (-1 < (long)puVar16) break;
          if (*puVar11 != 4) goto LAB_00110b48;
          uVar25 = *(uint *)((long)&w[-2].wq.next + 4);
          __iovec_00 = (uv__work *)w[-2].wq.prev;
        }
        if (puVar16 == (uv__queue *)0x0) {
          puVar16 = (uv__queue *)0x0;
LAB_00110b48:
          if (puStackY_21b0 == (uv__queue *)0x0) {
            puStackY_21b0 = puVar16;
          }
          break;
        }
        if (-1 < (long)w[-1].work) {
          w[-1].work = (_func_void_uv__work_ptr *)((long)&puVar16->next + (long)w[-1].work);
        }
        puVar17 = w[-2].wq.prev;
        ppuVar23 = &puVar17->prev;
        uVar25 = 0;
        for (puVar24 = puVar16; puVar24 != (uv__queue *)0x0;
            puVar24 = (uv__queue *)((long)puVar24 - (long)puVar15)) {
          puVar15 = *ppuVar23;
          if (puVar24 <= puVar15 && (uv__queue *)((long)puVar15 - (long)puVar24) != (uv__queue *)0x0
             ) {
            ((uv__queue *)(ppuVar23 + -1))->next =
                 (uv__queue *)((long)&puVar24->next + (long)((uv__queue *)(ppuVar23 + -1))->next);
            *ppuVar23 = (uv__queue *)((long)puVar15 - (long)puVar24);
            puVar17 = w[-2].wq.prev;
            break;
          }
          uVar25 = uVar25 + 1;
          ppuVar23 = ppuVar23 + 2;
        }
        *(uint *)((long)&w[-2].wq.next + 4) = uVar25;
        __iovec_00 = (uv__work *)(puVar17 + uVar25);
        w[-2].wq.prev = (uv__queue *)__iovec_00;
        puStackY_21b0 = (uv__queue *)((long)&puVar16->next + (long)&puStackY_21b0->next);
      }
      if (puVar2 != w + 1) {
        uv__free(puVar2);
      }
      w[-2].wq.prev = (uv__queue *)0x0;
      *(undefined4 *)((long)&w[-2].wq.next + 4) = 0;
      goto LAB_0011062e;
    case 5:
      iVar6 = *(int *)&w[-2].loop;
      iVar10 = *(int *)((long)&w[-2].loop + 4);
      local_2158.st_dev = (__dev_t)w[-1].work;
      len = w[1].done;
      if (uv__fs_try_copy_file_range_no_copy_file_range_support != 0) goto LAB_0010fd31;
      sVar20 = uv__fs_copy_file_range(iVar10,(off_t *)&local_2158,iVar6,(off_t *)0x0,(size_t)len,0);
      if (sVar20 == -1) {
        uVar8 = *puVar11;
        if (uVar8 == 1) {
          iVar5 = uv__is_cifs_or_smb(iVar6);
          if (iVar5 == 0) goto LAB_00110a33;
LAB_0010fd31:
          *puVar11 = 0x26;
LAB_0010fd3c:
          sVar12 = sendfile64(iVar6,iVar10,(__off64_t *)&local_2158,(size_t)len);
          if (sVar12 != -1) goto LAB_001106c2;
        }
        else {
          if ((uVar8 == 0x5f) || (uVar8 == 0x12)) goto LAB_0010fd31;
          if (uVar8 == 0x26) {
            uv__fs_try_copy_file_range_no_copy_file_range_support = 1;
LAB_00110a33:
            uVar8 = *puVar11;
          }
          else if (uVar8 == 0xd) {
            iVar5 = fstatfs64(iVar10,(statfs64 *)&s);
            if (((iVar5 != -1) && (s.f_type == 0xc36400)) &&
               (uVar8 = uv__kernel_version(), uVar8 < 0x41400)) goto LAB_0010fd31;
            goto LAB_00110a33;
          }
          if (uVar8 == 0x26) goto LAB_0010fd3c;
        }
        if ((long)local_2158.st_dev <= (long)w[-1].work) {
          uVar8 = *puVar11;
          if (((uVar8 < 0x17) && ((0x440020U >> (uVar8 & 0x1f) & 1) != 0)) || (uVar8 == 0x58)) {
            bVar3 = true;
            *puVar11 = 0;
            puVar16 = (uv__queue *)w[1].done;
            iVar6 = *(int *)&w[-2].loop;
            iVar10 = *(int *)((long)&w[-2].loop + 4);
            local_2180 = w[-1].work;
            puStackY_21b0 = (uv__queue *)0x0;
LAB_0010fdb3:
            for (; uVar13 = (long)puVar16 - (long)puStackY_21b0,
                puStackY_21b0 <= puVar16 && uVar13 != 0;
                puStackY_21b0 = (uv__queue *)((long)&puStackY_21b0->next + lVar26)) {
              sVar19 = 0x2000;
              if (uVar13 < 0x2000) {
                sVar19 = uVar13;
              }
              while( true ) {
                if (bVar3) {
                  lVar26 = pread64(iVar10,&s,sVar19,(__off64_t)local_2180);
                }
                else {
                  lVar26 = read(iVar10,&s,sVar19);
                }
                if (lVar26 != -1) break;
                uVar8 = *puVar11;
                if (uVar8 != 4) goto code_r0x0010fe0c;
              }
              if (lVar26 == 0) break;
              for (lVar21 = 0; lVar26 - lVar21 != 0 && lVar21 <= lVar26; lVar21 = lVar21 + sVar12) {
                while (sVar12 = write(iVar6,(void *)((long)&((statfs *)(&s.f_fsid + -7))->f_type +
                                                    lVar21),lVar26 - lVar21), sVar12 == -1) {
                  if (*puVar11 != 4) {
                    if (*puVar11 != 0xb) {
                      puStackY_21b0 = (uv__queue *)0xffffffffffffffff;
                      goto LAB_0011062e;
                    }
                    pfd.events = 4;
                    pfd.revents = 0;
                    pfd.fd = iVar6;
                    while (iVar5 = poll((pollfd *)&pfd,1,-1), iVar5 == -1) {
                      if (*puVar11 != 4) goto LAB_001109df;
                    }
                    if ((pfd.revents & 0xfffbU) != 0) {
LAB_001109df:
                      *puVar11 = 5;
                      goto LAB_001109eb;
                    }
                  }
                }
              }
              local_2180 = local_2180 + lVar26;
            }
            if (puStackY_21b0 != (uv__queue *)0xffffffffffffffff) goto LAB_001109d1;
            goto LAB_001107f4;
          }
LAB_001109eb:
          puStackY_21b0 = (uv__queue *)0xffffffffffffffff;
          goto LAB_0011062e;
        }
      }
LAB_001106c2:
      puStackY_21b0 = (uv__queue *)(local_2158.st_dev + -(long)w[-1].work);
      w[-1].work = (_func_void_uv__work_ptr *)local_2158.st_dev;
      goto LAB_0011062e;
    case 6:
      p_Var22 = w[-6].work;
      iVar6 = uv__fs_statx(-1,(char *)p_Var22,0,0,(uv_stat_t *)buf);
      if (iVar6 == -0x26) {
        iVar6 = stat64((char *)p_Var22,(stat64 *)&s);
LAB_001103eb:
        if (iVar6 == 0) {
          uv__to_stat((stat *)&s,(uv_stat_t *)buf);
          iVar6 = 0;
        }
      }
      break;
    case 7:
      p_Var22 = w[-6].work;
      iVar6 = uv__fs_statx(-1,(char *)p_Var22,0,1,(uv_stat_t *)buf);
      if (iVar6 == -0x26) {
        iVar6 = lstat64((char *)p_Var22,(stat64 *)&s);
        goto LAB_001103eb;
      }
      break;
    case 8:
      iVar10 = *(int *)&w[-2].loop;
      iVar6 = uv__fs_statx(iVar10,"",1,0,(uv_stat_t *)buf);
      if ((iVar6 == -0x26) && (iVar6 = fstat64(iVar10,(stat64 *)&s), iVar6 == 0)) {
        uv__to_stat((stat *)&s,(uv_stat_t *)buf);
        iVar6 = 0;
      }
      break;
    case 9:
      iVar6 = ftruncate64(*(int *)&w[-2].loop,(__off64_t)w[-1].work);
      break;
    case 10:
      s._0_16_ = uv__fs_to_timespec((double)w[-1].wq.next);
      s._16_16_ = uv__fs_to_timespec((double)w[-1].wq.prev);
      p_Var22 = w[-6].work;
      iVar6 = 0;
      goto LAB_0010ff5c;
    case 0xb:
      s._0_16_ = uv__fs_to_timespec((double)w[-1].wq.next);
      s._16_16_ = uv__fs_to_timespec((double)w[-1].wq.prev);
      iVar6 = futimens(*(int *)&w[-2].loop,(timespec *)&s);
      break;
    case 0xc:
      iVar6 = access((char *)w[-6].work,*(int *)((long)&w[-2].loop + 4));
      break;
    case 0xd:
      iVar6 = chmod((char *)w[-6].work,*(__mode_t *)&w[-2].wq.next);
      break;
    case 0xe:
      iVar6 = fchmod(*(int *)&w[-2].loop,*(__mode_t *)&w[-2].wq.next);
      break;
    case 0xf:
      iVar6 = fsync(*(int *)&w[-2].loop);
      break;
    case 0x10:
      iVar6 = fdatasync(*(int *)&w[-2].loop);
      break;
    case 0x11:
      iVar6 = unlink((char *)w[-6].work);
      break;
    case 0x12:
      iVar6 = rmdir((char *)w[-6].work);
      break;
    case 0x13:
      iVar6 = mkdir((char *)w[-6].work,*(__mode_t *)&w[-2].wq.next);
      break;
    case 0x14:
      pcVar18 = mkdtemp((char *)w[-6].work);
      puStackY_21b0 = (uv__queue *)-(ulong)(pcVar18 == (char *)0x0);
      goto LAB_0011062e;
    case 0x15:
      iVar6 = rename((char *)w[-6].work,(char *)w[-2].done);
      break;
    case 0x16:
      auVar4._8_8_ = 0;
      auVar4._0_8_ = s.f_bsize;
      s._0_16_ = auVar4 << 0x40;
      iVar6 = scandir64((char *)w[-6].work,(dirent64 ***)&s,uv__fs_scandir_filter,
                        uv__fs_scandir_sort);
      *(undefined4 *)((long)&w[-2].wq.next + 4) = 0;
      if (iVar6 != -1) {
        puVar16 = (uv__queue *)s.f_type;
        if (iVar6 == 0) {
          free((void *)s.f_type);
          puVar16 = (uv__queue *)0x0;
        }
        w[-7].wq.prev = puVar16;
        goto LAB_00110727;
      }
LAB_0011070a:
      puStackY_21b0 = (uv__queue *)0xffffffffffffffff;
      goto LAB_0011062e;
    case 0x17:
      iVar6 = link((char *)w[-6].work,(char *)w[-2].done);
      break;
    case 0x18:
      iVar6 = symlink((char *)w[-6].work,(char *)w[-2].done);
      break;
    case 0x19:
      sVar14 = pathconf((char *)w[-6].work,4);
      sVar19 = 0x1000;
      if (sVar14 != 0xffffffffffffffff) {
        sVar19 = sVar14;
      }
      puVar16 = (uv__queue *)uv__malloc(sVar19);
      if (puVar16 == (uv__queue *)0x0) {
        *puVar11 = 0xc;
      }
      else {
        sVar14 = readlink((char *)w[-6].work,(char *)puVar16,sVar19);
        if (sVar14 == 0xffffffffffffffff) {
          uv__free(puVar16);
        }
        else if ((sVar14 != sVar19) ||
                (puVar16 = (uv__queue *)uv__reallocf(puVar16,sVar19 + 1), sVar14 = sVar19,
                puVar16 != (uv__queue *)0x0)) {
          *(char *)((long)&puVar16->next + sVar14) = '\0';
          goto LAB_00110c3f;
        }
      }
      goto LAB_00110638;
    case 0x1a:
      iVar6 = chown((char *)w[-6].work,*(__uid_t *)&w[-1].done,*(__gid_t *)((long)&w[-1].done + 4));
      break;
    case 0x1b:
      iVar6 = fchown(*(int *)&w[-2].loop,*(__uid_t *)&w[-1].done,*(__gid_t *)((long)&w[-1].done + 4)
                    );
      break;
    case 0x1c:
      iVar6 = lchown((char *)w[-6].work,*(__uid_t *)&w[-1].done,*(__gid_t *)((long)&w[-1].done + 4))
      ;
      break;
    case 0x1d:
      puVar16 = (uv__queue *)realpath((char *)w[-6].work,(char *)0x0);
      if (puVar16 != (uv__queue *)0x0) goto LAB_00110c3f;
      goto LAB_00110638;
    case 0x1e:
      iVar6 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&s,(char *)w[-6].work,0,0,(uv_fs_cb)0x0);
      uv_fs_req_cleanup((uv_fs_t *)&s);
      uVar8 = (uint)s.f_spare[0];
      if (iVar6 < 0) goto LAB_00110727;
      iVar6 = fstat64((uint)s.f_spare[0],(stat64 *)&pfd);
      if (iVar6 == 0) {
        uVar9 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&s,(char *)w[-2].done,
                           (*(uint *)((long)&w[-2].loop + 4) & 1) << 7 | 0x41,local_20b0,
                           (uv_fs_cb)0x0);
        uv_fs_req_cleanup((uv_fs_t *)&s);
        local_2194 = (uint)s.f_spare[0];
        if (-1 < (int)uVar9) {
          if (((ulong)w[-2].loop & 0x100000000) == 0) {
            iVar6 = fstat64((uint)s.f_spare[0],&local_2158);
            if (iVar6 == 0) {
              if (((_func_void_uv__work_ptr *)CONCAT26(pfd.revents,CONCAT24(pfd.events,pfd.fd)) ==
                   (_func_void_uv__work_ptr *)local_2158.st_dev) &&
                 (local_20c0 == local_2158.st_ino)) {
                uVar25 = 0;
                goto LAB_00110574;
              }
              iVar6 = ftruncate64(local_2194,0);
              if ((iVar6 == 0) ||
                 ((uVar25 = -*puVar11, *puVar11 == 0xd && (uVar9 = 0, local_2158.st_size < 1))))
              goto LAB_00110a7d;
            }
            else {
              uVar25 = -*puVar11;
            }
          }
          else {
LAB_00110a7d:
            iVar6 = fchmod(local_2194,local_20b0);
            if (iVar6 == -1) {
              if (*puVar11 != 1) {
                uVar25 = -*puVar11;
                goto LAB_00110565;
              }
              iVar6 = uv__is_cifs_or_smb(local_2194);
              uVar9 = 0;
              if (iVar6 == 0) {
                uVar25 = 0xffffffff;
                goto LAB_00110574;
              }
            }
            if (((ulong)w[-2].loop & 0x600000000) != 0) {
              uVar25 = 0;
              iVar6 = ioctl(local_2194,0x40049409,(ulong)uVar8);
              if (iVar6 == 0) goto LAB_00110574;
              if (((ulong)w[-2].loop & 0x400000000) != 0) {
                uVar25 = -*puVar11;
                goto LAB_00110565;
              }
            }
            lVar26 = 0;
            for (len_00 = local_2098; uVar25 = uVar9, len_00 != 0; len_00 = len_00 - lVar21) {
              uv_fs_sendfile((uv_loop_t *)0x0,(uv_fs_t *)&s,local_2194,uVar8,lVar26,len_00,
                             (uv_fs_cb)0x0);
              iVar6 = s.f_spare[0]._4_4_;
              uVar25 = (uint)s.f_spare[0];
              lVar21 = CONCAT44(s.f_spare[0]._4_4_,(uint)s.f_spare[0]);
              uv_fs_req_cleanup((uv_fs_t *)&s);
              if (iVar6 < 0) break;
              lVar26 = lVar26 + lVar21;
            }
          }
          goto LAB_00110565;
        }
        local_2194 = 0xffffffff;
        uVar25 = uVar9;
      }
      else {
        local_2194 = 0xffffffff;
        uVar25 = -*puVar11;
LAB_00110565:
        uVar25 = (int)uVar25 >> 0x1f & uVar25;
      }
LAB_00110574:
      uVar8 = uv__close_nocheckstdio(uVar8);
      if (uVar8 == 0) {
        uVar8 = uVar25;
      }
      if (uVar25 != 0) {
        uVar8 = uVar25;
      }
      if ((int)local_2194 < 0) {
        if (uVar8 == 0) {
LAB_001107fd:
          puStackY_21b0 = (uv__queue *)0x0;
          goto LAB_0011062e;
        }
      }
      else {
        uVar9 = uv__close_nocheckstdio(local_2194);
        if (uVar9 == 0) {
          uVar9 = uVar8;
        }
        if (uVar8 == 0) {
          uVar8 = uVar9;
        }
        if (uVar8 == 0) goto LAB_001107fd;
        uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)&s,(char *)w[-2].done,(uv_fs_cb)0x0);
        uv_fs_req_cleanup((uv_fs_t *)&s);
      }
      *puVar11 = -uVar8;
LAB_001107f4:
      puStackY_21b0 = (uv__queue *)0xffffffffffffffff;
      goto LAB_0011062e;
    case 0x1f:
      puVar16 = (uv__queue *)uv__malloc(0x38);
      if (puVar16 == (uv__queue *)0x0) {
LAB_00110653:
        uv__free(puVar16);
        puStackY_21b0 = (uv__queue *)0xffffffffffffffff;
        puVar16 = (uv__queue *)0x0;
      }
      else {
        puVar17 = (uv__queue *)opendir((char *)w[-6].work);
        puVar16[3].next = puVar17;
        if (puVar17 == (uv__queue *)0x0) goto LAB_00110653;
        puStackY_21b0 = (uv__queue *)0x0;
      }
      w[-7].wq.prev = puVar16;
      goto LAB_0011062e;
    case 0x20:
      puVar16 = w[-7].wq.prev;
      local_2194 = 0;
      while( true ) {
        puVar17 = (uv__queue *)(ulong)local_2194;
        do {
          if (puVar16->prev <= puVar17) goto LAB_00110733;
          *puVar11 = 0;
          dent = readdir64((DIR *)puVar16[3].next);
          if (dent == (dirent64 *)0x0) {
            if (*puVar11 != 0) goto LAB_00110675;
            goto LAB_00110733;
          }
        } while ((dent->d_name[0] == '.') &&
                ((dent->d_name[1] == '\0' || ((dent->d_name[1] == '.' && (dent->d_name[2] == '\0')))
                 )));
        puVar24 = puVar16->next;
        puVar15 = (uv__queue *)uv__strdup(dent->d_name);
        puVar24[(long)puVar17].next = puVar15;
        if (puVar15 == (uv__queue *)0x0) break;
        uVar7 = uv__fs_get_dirent_type((uv__dirent_t *)dent);
        *(uv_dirent_type_t *)&puVar24[(long)puVar17].prev = uVar7;
        local_2194 = local_2194 + 1;
      }
LAB_00110675:
      for (lVar26 = 0; (ulong)local_2194 << 4 != lVar26; lVar26 = lVar26 + 0x10) {
        uv__free(*(void **)((long)&puVar16->next->next + lVar26));
        *(undefined8 *)((long)&puVar16->next->next + lVar26) = 0;
      }
      local_2194 = 0xffffffff;
LAB_00110733:
      puStackY_21b0 = (uv__queue *)(long)(int)local_2194;
      goto LAB_0011062e;
    case 0x21:
      puVar16 = w[-7].wq.prev;
      if (puVar16[3].next != (uv__queue *)0x0) {
        closedir((DIR *)puVar16[3].next);
        puVar16[3].next = (uv__queue *)0x0;
        puVar16 = w[-7].wq.prev;
      }
      uv__free(puVar16);
      puVar16 = (uv__queue *)0x0;
LAB_00110c3f:
      w[-7].wq.prev = puVar16;
      w[-7].wq.next = (uv__queue *)0x0;
      goto LAB_00110bd8;
    case 0x22:
      puStackY_21b0 = (uv__queue *)0xffffffffffffffff;
      iVar6 = statfs64((char *)w[-6].work,(statfs64 *)&s);
      if (iVar6 == 0) {
        puVar16 = (uv__queue *)uv__malloc(0x58);
        if (puVar16 == (uv__queue *)0x0) {
          *puVar11 = 0xc;
        }
        else {
          puVar16->next = (uv__queue *)s.f_type;
          puVar16->prev = (uv__queue *)s.f_bsize;
          puVar16[1].next = (uv__queue *)s.f_blocks;
          puVar16[1].prev = (uv__queue *)s.f_bfree;
          puVar16[2].next = (uv__queue *)s.f_bavail;
          puVar16[2].prev = (uv__queue *)s.f_files;
          puVar16[3].next = (uv__queue *)s.f_ffree;
          w[-7].wq.prev = puVar16;
          puStackY_21b0 = (uv__queue *)0x0;
        }
      }
      goto LAB_0011062e;
    case 0x23:
      p_Var22 = w[-6].work;
      sVar19 = strlen((char *)p_Var22);
      if ((sVar19 < 6) || (iVar6 = strcmp((char *)(p_Var22 + (sVar19 - 6)),"XXXXXX"), iVar6 != 0)) {
        *puVar11 = 0x16;
        iVar6 = -1;
      }
      else {
        uv_once(&uv__fs_mkstemp_once,uv__mkostemp_initonce);
        if (uv__mkostemp != (_func_int_char_ptr_int *)0x0 && uv__fs_mkstemp_no_cloexec_support == 0)
        {
          iVar6 = (*uv__mkostemp)((char *)p_Var22,0x80000);
          if (-1 < iVar6) goto LAB_00110727;
          if (*puVar11 != 0x16) goto LAB_00110613;
          uv__fs_mkstemp_no_cloexec_support = 1;
        }
        if (w[-7].loop != (uv_loop_s *)0x0) {
          uv_rwlock_rdlock((uv_rwlock_t *)(w[-9].wq.next + 0x13));
        }
        iVar6 = mkstemp64((char *)p_Var22);
        if ((-1 < iVar6) && (iVar10 = uv__cloexec(iVar6,1), iVar10 != 0)) {
          iVar6 = uv__close(iVar6);
          if (iVar6 != 0) {
switchD_0010fc64_default:
            abort();
          }
          iVar6 = -1;
        }
        if (w[-7].loop != (uv_loop_s *)0x0) {
          uv_rwlock_rdunlock((uv_rwlock_t *)(w[-9].wq.next + 0x13));
        }
        if (-1 < iVar6) goto LAB_00110727;
      }
LAB_00110613:
      *p_Var22 = (_func_void_uv__work_ptr)0x0;
LAB_00110727:
      puStackY_21b0 = (uv__queue *)(long)iVar6;
      goto LAB_0011062e;
    case 0x24:
      s._0_16_ = uv__fs_to_timespec((double)w[-1].wq.next);
      s._16_16_ = uv__fs_to_timespec((double)w[-1].wq.prev);
      p_Var22 = w[-6].work;
      iVar6 = 0x100;
LAB_0010ff5c:
      iVar6 = utimensat(-100,(char *)p_Var22,(timespec *)&s,iVar6);
      break;
    default:
      goto switchD_0010fc64_default;
    }
    puStackY_21b0 = (uv__queue *)(long)iVar6;
LAB_0011062e:
    if (puStackY_21b0 != (uv__queue *)0xffffffffffffffff) {
      w[-7].wq.next = puStackY_21b0;
      if (puStackY_21b0 != (uv__queue *)0x0) {
        return;
      }
LAB_00110bd8:
      if (2 < *(int *)&w[-7].done - 6U) {
        return;
      }
      w[-7].wq.prev = (uv__queue *)buf;
      return;
    }
LAB_00110638:
    if ((0xfffffffd < iVar1 - 4U) || (*puVar11 != 4)) {
      w[-7].wq.next = (uv__queue *)-(long)(int)*puVar11;
      return;
    }
  } while( true );
code_r0x0010fe0c:
  if ((puStackY_21b0 != (uv__queue *)0x0) || (!bVar3)) {
    if ((code *)((long)&puStackY_21b0->next + 1U) < (code *)0x2) goto LAB_001107f4;
LAB_001109d1:
    w[-1].work = local_2180;
    goto LAB_0011062e;
  }
  puStackY_21b0 = (uv__queue *)0x0;
  bVar3 = false;
  if ((uVar8 == 5) || (uVar8 == 0x1d)) goto LAB_0010fdb3;
  goto LAB_0011070a;
}

Assistant:

static void uv__fs_work(struct uv__work* w) {
  int retry_on_eintr;
  uv_fs_t* req;
  ssize_t r;

  req = container_of(w, uv_fs_t, work_req);
  retry_on_eintr = !(req->fs_type == UV_FS_CLOSE ||
                     req->fs_type == UV_FS_READ);

  do {
    errno = 0;

#define X(type, action)                                                       \
  case UV_FS_ ## type:                                                        \
    r = action;                                                               \
    break;

    switch (req->fs_type) {
    X(ACCESS, access(req->path, req->flags));
    X(CHMOD, chmod(req->path, req->mode));
    X(CHOWN, chown(req->path, req->uid, req->gid));
    X(CLOSE, uv__fs_close(req->file));
    X(COPYFILE, uv__fs_copyfile(req));
    X(FCHMOD, fchmod(req->file, req->mode));
    X(FCHOWN, fchown(req->file, req->uid, req->gid));
    X(LCHOWN, lchown(req->path, req->uid, req->gid));
    X(FDATASYNC, uv__fs_fdatasync(req));
    X(FSTAT, uv__fs_fstat(req->file, &req->statbuf));
    X(FSYNC, uv__fs_fsync(req));
    X(FTRUNCATE, ftruncate(req->file, req->off));
    X(FUTIME, uv__fs_futime(req));
    X(LUTIME, uv__fs_lutime(req));
    X(LSTAT, uv__fs_lstat(req->path, &req->statbuf));
    X(LINK, link(req->path, req->new_path));
    X(MKDIR, mkdir(req->path, req->mode));
    X(MKDTEMP, uv__fs_mkdtemp(req));
    X(MKSTEMP, uv__fs_mkstemp(req));
    X(OPEN, uv__fs_open(req));
    X(READ, uv__fs_read(req));
    X(SCANDIR, uv__fs_scandir(req));
    X(OPENDIR, uv__fs_opendir(req));
    X(READDIR, uv__fs_readdir(req));
    X(CLOSEDIR, uv__fs_closedir(req));
    X(READLINK, uv__fs_readlink(req));
    X(REALPATH, uv__fs_realpath(req));
    X(RENAME, rename(req->path, req->new_path));
    X(RMDIR, rmdir(req->path));
    X(SENDFILE, uv__fs_sendfile(req));
    X(STAT, uv__fs_stat(req->path, &req->statbuf));
    X(STATFS, uv__fs_statfs(req));
    X(SYMLINK, symlink(req->path, req->new_path));
    X(UNLINK, unlink(req->path));
    X(UTIME, uv__fs_utime(req));
    X(WRITE, uv__fs_write_all(req));
    default: abort();
    }
#undef X
  } while (r == -1 && errno == EINTR && retry_on_eintr);

  if (r == -1)
    req->result = UV__ERR(errno);
  else
    req->result = r;

  if (r == 0 && (req->fs_type == UV_FS_STAT ||
                 req->fs_type == UV_FS_FSTAT ||
                 req->fs_type == UV_FS_LSTAT)) {
    req->ptr = &req->statbuf;
  }
}